

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessbackend.cpp
# Opt level: O0

void __thiscall
QNetworkAccessBackendFactory::QNetworkAccessBackendFactory(QNetworkAccessBackendFactory *this)

{
  Type *pTVar1;
  QObject *in_RDI;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_factoryData>_>
  *in_stack_ffffffffffffffe8;
  
  QObject::QObject(in_RDI,(QObject *)0x0);
  *(undefined ***)in_RDI = &PTR_metaObject_00499bc8;
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_factoryData>_>::
           operator()(in_stack_ffffffffffffffe8);
  if (pTVar1 != (Type *)0x0) {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_factoryData>_>::operator->
              ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_factoryData>_> *)
               0x189541);
    QList<QNetworkAccessBackendFactory_*>::append
              ((QList<QNetworkAccessBackendFactory_*> *)0x18954e,
               (parameter_type)in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

QNetworkAccessBackendFactory::QNetworkAccessBackendFactory()
{
    if (factoryData())
        factoryData->append(this);
}